

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cc
# Opt level: O0

void __thiscall
iqxmlrpc::anon_unknown_0::Http_server_connection::log_exception
          (Http_server_connection *this,exception *ex)

{
  char *pcVar1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string s;
  exception *ex_local;
  Http_server_connection *this_local;
  
  s.field_2._8_8_ = ex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"iqxmlrpc::Http_server_connection: ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = (char *)(**(code **)(*(long *)s.field_2._8_8_ + 0x10))();
  std::__cxx11::string::operator+=((string *)local_38,pcVar1);
  Server::log_err_msg((this->super_Server_connection).server,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Http_server_connection::log_exception( const std::exception& ex )
{
  std::string s( "iqxmlrpc::Http_server_connection: " );
  s += ex.what();
  server->log_err_msg( s );
}